

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O2

void __thiscall CLParam<double>::Print(CLParam<double> *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"# ");
  poVar1 = std::operator<<(poVar1,(string *)&this->description);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"# [Default = ");
  poVar1 = std::ostream::_M_insert<double>(this->default_value);
  poVar1 = std::operator<<(poVar1,"]");
  std::endl<char,std::char_traits<char>>(poVar1);
  PrintSimple(this);
  return;
}

Assistant:

void Print()
    {
        std::cout << "# " << description << std::endl ;
        std::cout << "# [Default = " << default_value << "]" << std::endl;
        PrintSimple() ;
    }